

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

void * qp_pop_ptr(priority_queue *qp)

{
  void *pvVar1;
  priority_queue_element *ppVar2;
  undefined4 uVar3;
  priority_queue_element *ppVar4;
  void *result;
  priority_queue *qp_local;
  
  if (((qp != (priority_queue *)0x0) && (qp->count != 0)) && (qp->count <= qp->size)) {
    pvVar1 = (qp->data->payload).p;
    qp->count = qp->count - 1;
    ppVar2 = qp->data;
    ppVar4 = qp->data + qp->count;
    ppVar2->payload = ppVar4->payload;
    uVar3 = *(undefined4 *)&ppVar4->field_0xc;
    ppVar2->priority = ppVar4->priority;
    *(undefined4 *)&ppVar2->field_0xc = uVar3;
    down_heap(qp,0);
    return pvVar1;
  }
  __assert_fail("qp && qp->count > 0 && qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                ,0x182,"void *qp_pop_ptr(struct priority_queue *)");
}

Assistant:

void *qp_pop_ptr(struct priority_queue *qp)
{
	void *result;

	assert(qp && qp->count > 0 && qp->count <= qp->size);
	result = qp->data[0].payload.p;
	--qp->count;
	qp->data[0] = qp->data[qp->count];
	down_heap(qp, 0);
	return result;
}